

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::CheckInvariants(GraphCycles *this)

{
  Rep *pRVar1;
  Node *pNVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  void *ptr;
  int32_t _cursor;
  int32_t y;
  PointerMap *local_70;
  NodeSet ranks;
  
  pRVar1 = this->rep_;
  synchronization_internal::anon_unknown_0::NodeSet::NodeSet(&ranks);
  local_70 = &pRVar1->ptrmap_;
  uVar5 = 0;
  while( true ) {
    if ((pRVar1->nodes_).size_ <= uVar5) {
      synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&ranks.table_);
      return true;
    }
    pNVar2 = (pRVar1->nodes_).ptr_[uVar5];
    if (pNVar2->masked_ptr != 0xf03a5f7bf03a5f7b) {
      ptr = (void *)(pNVar2->masked_ptr ^ 0xf03a5f7bf03a5f7b);
      uVar4 = synchronization_internal::anon_unknown_0::PointerMap::Find(local_70,ptr);
      if (uVar5 != uVar4) {
        raw_log_internal::RawLog
                  (kFatal,"graphcycles.cc",400,"Did not find live node in hash table %u %p",
                   uVar5 & 0xffffffff,ptr);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                      ,400,
                      "bool absl::synchronization_internal::GraphCycles::CheckInvariants() const");
      }
    }
    if (pNVar2->visited == true) break;
    bVar3 = synchronization_internal::anon_unknown_0::NodeSet::insert(&ranks,pNVar2->rank);
    if (!bVar3) {
      raw_log_internal::RawLog
                (kFatal,"graphcycles.cc",0x196,"Duplicate occurrence of rank %d",
                 (ulong)(uint)pNVar2->rank);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                    ,0x196,
                    "bool absl::synchronization_internal::GraphCycles::CheckInvariants() const");
    }
    _cursor = 0;
    while( true ) {
      bVar3 = synchronization_internal::anon_unknown_0::NodeSet::Next(&pNVar2->out,&_cursor,&y);
      if (!bVar3) break;
      uVar4 = (pRVar1->nodes_).ptr_[(uint)y]->rank;
      if ((int)uVar4 <= pNVar2->rank) {
        raw_log_internal::RawLog
                  (kFatal,"graphcycles.cc",0x19e,"Edge %u ->%d has bad rank assignment %d->%d",
                   uVar5 & 0xffffffff,(ulong)(uint)y,(ulong)(uint)pNVar2->rank,(ulong)uVar4);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                      ,0x19e,
                      "bool absl::synchronization_internal::GraphCycles::CheckInvariants() const");
      }
    }
    uVar5 = uVar5 + 1;
  }
  raw_log_internal::RawLog
            (kFatal,"graphcycles.cc",0x193,"Did not clear visited marker on node %u",
             uVar5 & 0xffffffff);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                ,0x193,"bool absl::synchronization_internal::GraphCycles::CheckInvariants() const");
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (uint32_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = r->nodes_[x];
    void* ptr = base_internal::UnhidePtr<void>(nx->masked_ptr);
    if (ptr != nullptr && static_cast<uint32_t>(r->ptrmap_.Find(ptr)) != x) {
      ABSL_RAW_LOG(FATAL, "Did not find live node in hash table %" PRIu32 " %p",
                   x, ptr);
    }
    if (nx->visited) {
      ABSL_RAW_LOG(FATAL, "Did not clear visited marker on node %" PRIu32, x);
    }
    if (!ranks.insert(nx->rank)) {
      ABSL_RAW_LOG(FATAL, "Duplicate occurrence of rank %" PRId32, nx->rank);
    }
    HASH_FOR_EACH(y, nx->out) {
      Node* ny = r->nodes_[static_cast<uint32_t>(y)];
      if (nx->rank >= ny->rank) {
        ABSL_RAW_LOG(FATAL,
                     "Edge %" PRIu32 " ->%" PRId32
                     " has bad rank assignment %" PRId32 "->%" PRId32,
                     x, y, nx->rank, ny->rank);
      }
    }
  }
  return true;
}